

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnInp.cpp
# Opt level: O0

void __thiscall NaPetriCnInput::describe(NaPetriCnInput *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  NaPetriNode *pNVar4;
  NaPetriCnOutput *pNVar5;
  undefined4 extraout_var;
  NaPetriConnector *in_RDI;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar7;
  
  pcVar3 = NaPetriConnector::name(in_RDI);
  NaPrintLog("input connector \'%s\': ",pcVar3);
  pNVar4 = NaPetriConnector::host(in_RDI);
  if (pNVar4 == (NaPetriNode *)0x0) {
    NaPrintLog("no host node\n");
  }
  else {
    iVar1 = (*in_RDI->_vptr_NaPetriConnector[2])();
    if (iVar1 == 0) {
      NaPrintLog("no links\n");
    }
    else {
      uVar6 = *(uint *)&in_RDI[1]._vptr_NaPetriConnector;
      pNVar5 = adjoint((NaPetriCnInput *)CONCAT44(in_stack_ffffffffffffffec,uVar6));
      uVar7 = pNVar5->idData;
      iVar1 = (*in_RDI->_vptr_NaPetriConnector[8])();
      uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))();
      NaPrintLog("data_id=%d(%d)  data_dim=%u\n",(ulong)uVar6,(ulong)uVar7,(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void
NaPetriCnInput::describe ()
{
    NaPrintLog("input connector '%s': ", name());
    if(NULL == host()){
        NaPrintLog("no host node\n");
    }else if(0 == links()){
        NaPrintLog("no links\n");
    }else{
        NaPrintLog("data_id=%d(%d)  data_dim=%u\n",
                   idData, adjoint()->idData, data().dim());
    }
}